

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpge.cpp
# Opt level: O0

bool __thiscall jpge::memory_stream::put_buf(memory_stream *this,void *pBuf,int len)

{
  bool bVar1;
  uint buf_remaining;
  int len_local;
  void *pBuf_local;
  memory_stream *this_local;
  
  bVar1 = (uint)len <= this->m_buf_size - this->m_buf_ofs;
  if (bVar1) {
    memcpy(this->m_pBuf + this->m_buf_ofs,pBuf,(long)len);
    this->m_buf_ofs = len + this->m_buf_ofs;
  }
  return bVar1;
}

Assistant:

virtual bool put_buf(const void* pBuf, int len)
		{
			uint buf_remaining = m_buf_size - m_buf_ofs;
			if ((uint)len > buf_remaining)
				return false;
			memcpy(m_pBuf + m_buf_ofs, pBuf, len);
			m_buf_ofs += len;
			return true;
		}